

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

void Js::JavascriptObject::Restify
               (Var source,Var to,void *excludedStatic,void *excludedComputed,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ulong uVar5;
  undefined1 auStack_68 [8];
  BVSparse<Memory::Recycler> excluded;
  RecyclableObject *local_40;
  RecyclableObject *target;
  
  local_40 = (RecyclableObject *)0x0;
  BVar3 = JavascriptConversion::ToObject(to,scriptContext,&local_40);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x8b4,"(succeeded)","succeeded");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  excluded.lastFoundIndex.ptr = (BVSparseNode<Memory::Recycler> *)scriptContext->recycler;
  auStack_68 = (undefined1  [8])0x0;
  excluded.head.ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  excluded.alloc = (Type)0x0;
  target = (RecyclableObject *)source;
  Memory::Recycler::WBSetBit((char *)&excluded.alloc);
  excluded.alloc = (Type)auStack_68;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&excluded.alloc);
  if (*excludedStatic != 0) {
    uVar5 = 0;
    do {
      BVSparse<Memory::Recycler>::Set
                ((BVSparse<Memory::Recycler> *)auStack_68,
                 *(BVIndex *)((long)excludedStatic + uVar5 * 4 + 8));
      uVar5 = uVar5 + 1;
    } while (uVar5 < *excludedStatic);
  }
  if ((excludedStatic != excludedComputed) && (*excludedComputed != 0)) {
    uVar5 = 0;
    do {
      BVSparse<Memory::Recycler>::Set
                ((BVSparse<Memory::Recycler> *)auStack_68,
                 *(BVIndex *)((long)excludedComputed + uVar5 * 4 + 8));
      uVar5 = uVar5 + 1;
    } while (uVar5 < *excludedComputed);
  }
  CopyDataPropertiesHelper<false,false>
            (target,local_40,scriptContext,(BVSparse<Memory::Recycler> *)auStack_68);
  BVSparse<Memory::Recycler>::~BVSparse((BVSparse<Memory::Recycler> *)auStack_68);
  return;
}

Assistant:

void JavascriptObject::Restify(Var source, Var to, void* excludedStatic, void* excludedComputed, ScriptContext* scriptContext)
{
    RecyclableObject* target = nullptr;
    bool succeeded = JavascriptConversion::ToObject(to, scriptContext, &target);
    AssertOrFailFast(succeeded);

    const Js::PropertyIdArray* propIdsStatic = reinterpret_cast<const Js::PropertyIdArray*>(excludedStatic);
    const Js::PropertyIdArray* propIdsComputed = reinterpret_cast<const Js::PropertyIdArray*>(excludedComputed);
    // Create a set of the property ids for faster lookup
    BVSparse<Recycler> excluded(scriptContext->GetRecycler());
    for (uint32 i = 0; i < propIdsStatic->count; i++)
    {
        PropertyId id = propIdsStatic->elements[i];
        excluded.Set(id);
    }
    // If these two are equal, this means there were no computed properties
    // and the static array was passed in to indicate this
    if (propIdsStatic != propIdsComputed)
    {
        for (uint32 i = 0; i < propIdsComputed->count; i++)
        {
            PropertyId id = propIdsComputed->elements[i];
            excluded.Set(id);
        }
    }

    CopyDataPropertiesHelper<false, false>(source, target, scriptContext, &excluded);
}